

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O1

gboolean append_file_node(gpointer key,gpointer value,gpointer data)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  
  if (value == (gpointer)0x0) {
    puVar1 = (undefined8 *)g_malloc(0x10);
    *puVar1 = key;
    puVar1[1] = 0;
    uVar2 = g_slist_prepend(*data,puVar1);
    *(undefined8 *)data = uVar2;
  }
  else {
    g_tree_foreach(value,append_file_node,data);
  }
  return 0;
}

Assistant:

static gboolean append_file_node(gpointer key,
                                 gpointer value,
                                 gpointer data)
{
    GSList **files = (GSList **) data;
    if (value) {
        g_tree_foreach((Filetree) value,
                       append_file_node,
                       files);
    } else {
        struct filename_list_node *new_file_node;
        new_file_node = g_malloc(sizeof(struct filename_list_node));
        new_file_node->fr = (struct filename_representations*) key;
        new_file_node->d = NULL;
        *files = g_slist_prepend(*files, new_file_node);
    }
    return FALSE;
}